

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnet.cc
# Opt level: O0

string * bdnet_inet_ntoa_abi_cxx11_(string *__return_storage_ptr__,in_addr in)

{
  uint8_t *bytes;
  in_addr in_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bytes._4_1_ = (byte)in.s_addr;
  bytes._5_1_ = (byte)(in.s_addr >> 8);
  bytes._6_1_ = (byte)(in.s_addr >> 0x10);
  bytes._7_1_ = (byte)(in.s_addr >> 0x18);
  bd_sprintf(__return_storage_ptr__,"%u.%u.%u.%u",(ulong)bytes._4_1_,(ulong)bytes._5_1_,
             (ulong)bytes._6_1_,(ulong)bytes._7_1_);
  return __return_storage_ptr__;
}

Assistant:

std::string bdnet_inet_ntoa(struct in_addr in) {
	std::string str;
	uint8_t *bytes = (uint8_t *) &(in.s_addr);
	bd_sprintf(str, "%u.%u.%u.%u", (int) bytes[0], (int) bytes[1], (int) bytes[2], (int) bytes[3]);
	return str;
}